

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O2

int BN_set_bit(BIGNUM *a,int n)

{
  BIGNUM *pBVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  
  iVar4 = 0;
  if (-1 < n) {
    uVar3 = (uint)n >> 6;
    if (a->top <= (int)uVar3) {
      pBVar1 = bn_wexpand((BIGNUM *)a,uVar3 + 1);
      if (pBVar1 == (BIGNUM *)0x0) {
        return 0;
      }
      for (lVar2 = (long)a->top; lVar2 <= (long)(ulong)uVar3; lVar2 = lVar2 + 1) {
        a->d[lVar2] = 0;
      }
      a->top = uVar3 + 1;
    }
    a->d[uVar3] = a->d[uVar3] | 1L << ((byte)n & 0x3f);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int BN_set_bit(BIGNUM *a, int n)
{
    int i, j, k;

    if (n < 0)
        return 0;

    i = n / BN_BITS2;
    j = n % BN_BITS2;
    if (a->top <= i) {
        if (bn_wexpand(a, i + 1) == NULL)
            return (0);
        for (k = a->top; k < i + 1; k++)
            a->d[k] = 0;
        a->top = i + 1;
    }

    a->d[i] |= (((BN_ULONG)1) << j);
    bn_check_top(a);
    return (1);
}